

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

string * __thiscall
ICM::to_string<31ul>(string *__return_storage_ptr__,ICM *this,ConstDataPointer data)

{
  Type *pTVar1;
  ConstDataPointer data_local;
  
  pTVar1 = get<31ul>(this);
  std::__cxx11::to_string(__return_storage_ptr__,*pTVar1);
  return __return_storage_ptr__;
}

Assistant:

string to_string(ConstDataPointer data) {
		using std::to_string;
		using Common::Convert::to_string;
		using TypeBase::to_string;
		return to_string(*get<_TU>((void*)data));
	}